

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

Node * __thiscall czh::node::Node::operator=(Node *this,Node *v)

{
  _Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__rhs;
  variant_alternative_t<0UL,_variant<NodeData,_Value>_> *pvVar1;
  _List_node_base *p_Var2;
  undefined1 auStack_68 [72];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->name,&v->name);
  this->last_node = v->last_node;
  token::Token::Token((Token *)auStack_68,&v->czh_token);
  token::Token::operator=(&this->czh_token,(Token *)auStack_68);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)(auStack_68 + 8));
  if (*(__index_type *)
       ((long)&(v->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x48) ==
      '\0') {
    pvVar1 = std::get<0ul,czh::node::Node::NodeData,czh::value::Value>(&v->data);
    NodeData::NodeData((NodeData *)auStack_68,pvVar1);
    std::variant<czh::node::Node::NodeData,czh::value::Value>::
    emplace<0ul,czh::node::Node::NodeData>
              ((variant<czh::node::Node::NodeData,czh::value::Value> *)&this->data,
               (NodeData *)auStack_68);
    std::__cxx11::_List_base<czh::node::Node,_std::allocator<czh::node::Node>_>::_M_clear
              ((_List_base<czh::node::Node,_std::allocator<czh::node::Node>_> *)(auStack_68 + 0x30))
    ;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>_>_>
                 *)auStack_68);
    pvVar1 = std::get<0ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
    for (p_Var2 = (pvVar1->nodes).
                  super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl.
                  _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)&pvVar1->nodes
        ; p_Var2 = p_Var2->_M_next) {
      p_Var2[3]._M_next = (_List_node_base *)this;
    }
  }
  else {
    __rhs = (_Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)std::get<1ul,czh::node::Node::NodeData,czh::value::Value>(&v->data);
    std::__detail::__variant::
    _Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)auStack_68,__rhs);
    std::variant<czh::node::Node::NodeData,czh::value::Value>::operator=
              ((variant<czh::node::Node::NodeData,czh::value::Value> *)&this->data,
               (Value *)auStack_68);
    std::__detail::__variant::
    _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)auStack_68);
  }
  return this;
}

Assistant:

Node &operator=(const Node &v)
    {
      name = v.name;
      last_node = v.last_node;
      czh_token = token::Token(v.czh_token);
      if (v.is_node())
      {
        data.emplace<NodeData>(NodeData(std::get<NodeData>(v.data)));
        auto &nd = std::get<NodeData>(data);
        for (auto &r: nd.nodes)
        {
          r.last_node = this;
        }
      }
      else
      {
        data = Value(std::get<Value>(v.data));
      }
      return *this;
    }